

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O0

bool __thiscall diffusion::Tokenizer::is_empty(Tokenizer *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  Tokenizer *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->queue_mutex_);
  bVar1 = std::
          deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::empty(&this->processed_data_queue_);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return bVar1;
}

Assistant:

bool is_empty() const {
        std::lock_guard<std::mutex> lock(queue_mutex_);
        return processed_data_queue_.empty();
    }